

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inet_addr.cc
# Opt level: O0

void __thiscall iqnet::Inet_addr::Impl::Impl(Impl *this,int p)

{
  uint16_t uVar1;
  pointer_type psVar2;
  allocator<char> local_29;
  sockaddr_in local_28;
  int local_14;
  Impl *pIStack_10;
  int p_local;
  Impl *this_local;
  
  local_28.sin_family = 0;
  local_28.sin_port = 0;
  local_28.sin_addr.s_addr = 0;
  local_28.sin_zero[0] = '\0';
  local_28.sin_zero[1] = '\0';
  local_28.sin_zero[2] = '\0';
  local_28.sin_zero[3] = '\0';
  local_28.sin_zero[4] = '\0';
  local_28.sin_zero[5] = '\0';
  local_28.sin_zero[6] = '\0';
  local_28.sin_zero[7] = '\0';
  local_14 = p;
  pIStack_10 = this;
  boost::optional<sockaddr_in>::optional(&this->sa,&local_28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->host,"0.0.0.0",&local_29);
  std::allocator<char>::~allocator(&local_29);
  this->port = local_14;
  psVar2 = boost::optional<sockaddr_in>::operator->(&this->sa);
  psVar2->sin_family = 2;
  uVar1 = htons((uint16_t)this->port);
  psVar2 = boost::optional<sockaddr_in>::operator->(&this->sa);
  psVar2->sin_port = uVar1;
  psVar2 = boost::optional<sockaddr_in>::operator->(&this->sa);
  (psVar2->sin_addr).s_addr = 0;
  return;
}

Assistant:

Inet_addr::Impl::Impl( int p ):
  sa(SystemSockAddrIn()), host("0.0.0.0"), port(p)
{
  sa->sin_family = PF_INET;
  sa->sin_port = htons(port);
  sa->sin_addr.s_addr = INADDR_ANY;
}